

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

ON_Xform *
ON_Texture::GetPictureShrinkSurfaceTransformation
          (ON_Xform *__return_storage_ptr__,ON_Brep *original,ON_Brep *shrunk,ON_Xform *error_return
          )

{
  ON_Surface *original_00;
  ON_Surface *shrunk_00;
  
  if ((original == (ON_Brep *)0x0) ||
     ((original->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count !=
      1)) {
    original_00 = (ON_Surface *)0x0;
  }
  else {
    original_00 = ON_BrepFace::SurfaceOf
                            ((original->m_F).super_ON_ObjectArray<ON_BrepFace>.
                             super_ON_ClassArray<ON_BrepFace>.m_a);
  }
  if ((shrunk == (ON_Brep *)0x0) ||
     ((shrunk->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count != 1)
     ) {
    shrunk_00 = (ON_Surface *)0x0;
  }
  else {
    shrunk_00 = ON_BrepFace::SurfaceOf
                          ((shrunk->m_F).super_ON_ObjectArray<ON_BrepFace>.
                           super_ON_ClassArray<ON_BrepFace>.m_a);
  }
  GetPictureShrinkSurfaceTransformation(__return_storage_ptr__,original_00,shrunk_00,error_return);
  return __return_storage_ptr__;
}

Assistant:

ON_Xform ON_Texture::GetPictureShrinkSurfaceTransformation(
  const class ON_Brep* original,
  const class ON_Brep* shrunk,
  const ON_Xform* error_return
)
{
  const class ON_Surface* original_srf
    = (nullptr != original && 1 == original->m_F.Count())
    ? original->m_F[0].SurfaceOf()
    : nullptr;
  const class ON_Surface* shrunk_srf
    = (nullptr != shrunk && 1 == shrunk->m_F.Count())
    ? shrunk->m_F[0].SurfaceOf()
    : nullptr;
  return ON_Texture::GetPictureShrinkSurfaceTransformation(
    original_srf,
    shrunk_srf,
    error_return
  );
}